

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::error_already_set::~error_already_set(error_already_set *this)

{
  undefined1 local_20 [8];
  gil_scoped_acquire gil;
  error_already_set *this_local;
  
  *(undefined ***)this = &PTR__error_already_set_00182928;
  gil._8_8_ = this;
  if (this->value != (PyObject *)0x0) {
    gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)local_20);
    clear(this);
    gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)local_20);
  }
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

error_already_set::~error_already_set() {
    if (value) {
        gil_scoped_acquire gil;
        clear();
    }
}